

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O0

void pzshape::TPZShapeDisc::PolynomialWithoutScale
               (REAL C,REAL x0,REAL x,int degree,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
               int n)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  double in_XMM2_Qa;
  int ideriv;
  int p;
  REAL val;
  size_t in_stack_00000388;
  char *in_stack_00000390;
  double in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  TPZFMatrix<double> *in_stack_ffffffffffffff90;
  int local_48;
  int local_44;
  
  if (in_EDI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZShapeDisc::Polynomial the degree of the polynomial cannot be minus, aborting\n"
                   );
    pzinternal::DebugStopImpl(in_stack_00000390,in_stack_00000388);
  }
  (**(code **)(*in_RSI + 0x70))(in_RSI,(long)(in_EDI + 1),1);
  (**(code **)(*in_RDX + 0x70))(in_RDX,(long)in_ECX,(long)(in_EDI + 1));
  pdVar3 = TPZFMatrix<double>::operator()
                     (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                      (int64_t)in_stack_ffffffffffffff80);
  *pdVar3 = 1.0;
  if (in_EDI != 0) {
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                        (int64_t)in_stack_ffffffffffffff80);
    *pdVar3 = in_XMM2_Qa;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                        (int64_t)in_stack_ffffffffffffff80);
    *pdVar3 = 1.0;
    for (local_44 = 2; local_44 < in_EDI + 1; local_44 = local_44 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff90 = (TPZFMatrix<double> *)(*pdVar3 * in_XMM2_Qa);
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      *pdVar3 = (double)in_stack_ffffffffffffff90;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      dVar1 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      dVar2 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      *pdVar3 = dVar1 * in_XMM2_Qa + dVar2 * 1.0;
      for (local_48 = 2; local_48 <= in_ECX; local_48 = local_48 + 1) {
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                            (int64_t)in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff80 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                            (int64_t)in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff88 =
             in_XMM2_Qa * in_stack_ffffffffffffff80 + (double)local_48 * *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                            (int64_t)in_stack_ffffffffffffff80);
        *pdVar3 = in_stack_ffffffffffffff88;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeDisc::PolynomialWithoutScale(REAL C,REAL x0,REAL x,int degree,TPZFMatrix<REAL> & phi,TPZFMatrix<REAL> & dphi, int n){
#ifdef PZDEBUG
  if(IsZero(C)){
    DebugStop();
  }
#endif
   if(degree < 0){
      PZError << "TPZShapeDisc::Polynomial the degree of the polynomial cannot be minus, aborting\n";
      DebugStop();
   }
   phi.Redim(degree+1,1);
   dphi.Redim(n,degree+1);
   //grau zero ou constante
   phi(0,0) = 1.0;
   if(degree == 0) return;
   //grau 1
   REAL val = x;
   phi(1,0) = val;
   dphi(0,1) = 1.; 
   //grau maior que 1
   int p;
   degree++;
   for(p = 2;p < degree; p++) {
      phi(p,0) = phi(p-1,0)*val;
      int ideriv;
      dphi(0,p) = dphi(0,p-1)*val + phi(p-1,0)* 1.0;
      for(ideriv=2; ideriv<=n; ideriv++) {
	 dphi(ideriv-1,p) = val*dphi(ideriv-1,p-1)+(ideriv)*dphi(ideriv-2,p-1);
      }
   }         
}